

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O3

void mi_page_free_list_extend(mi_page_t *page,size_t bsize,size_t extend,mi_stats_t *stats)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  mi_block_t *pmVar4;
  long lVar5;
  long lVar6;
  
  puVar1 = page->page_start;
  uVar3 = (ulong)page->capacity;
  lVar5 = uVar3 * bsize;
  lVar6 = (extend + uVar3 + -1) * bsize;
  if (lVar5 - lVar6 == 0 || lVar5 < lVar6) {
    puVar2 = puVar1 + (uVar3 + 1) * bsize;
    pmVar4 = (mi_block_t *)(puVar1 + lVar5);
    do {
      pmVar4->next = (mi_encoded_t)puVar2;
      pmVar4 = (mi_block_t *)((long)&pmVar4->next + bsize);
      puVar2 = puVar2 + bsize;
    } while (pmVar4 <= (mi_block_t *)(puVar1 + lVar6));
  }
  ((mi_block_t *)(puVar1 + lVar6))->next = (mi_encoded_t)page->free;
  page->free = (mi_block_t *)(puVar1 + lVar5);
  return;
}

Assistant:

static mi_decl_noinline void mi_page_free_list_extend( mi_page_t* const page, const size_t bsize, const size_t extend, mi_stats_t* const stats)
{
  MI_UNUSED(stats);
  #if (MI_SECURE <= 2)
  mi_assert_internal(page->free == NULL);
  mi_assert_internal(page->local_free == NULL);
  #endif
  mi_assert_internal(page->capacity + extend <= page->reserved);
  mi_assert_internal(bsize == mi_page_block_size(page));
  void* const page_area = mi_page_start(page);

  mi_block_t* const start = mi_page_block_at(page, page_area, bsize, page->capacity);

  // initialize a sequential free list
  mi_block_t* const last = mi_page_block_at(page, page_area, bsize, page->capacity + extend - 1);
  mi_block_t* block = start;
  while(block <= last) {
    mi_block_t* next = (mi_block_t*)((uint8_t*)block + bsize);
    mi_block_set_next(page,block,next);
    block = next;
  }
  // prepend to free list (usually `NULL`)
  mi_block_set_next(page, last, page->free);
  page->free = start;
}